

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CS248::Application::drawHUD(Application *this)

{
  pointer piVar1;
  string local_30;
  
  OSDText::clear(&this->textManager);
  piVar1 = (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar1) {
    (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  OSDText::render(&this->textManager);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"end Application::drawHUD","")
  ;
  checkGLError(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Application::drawHUD() {
    textManager.clear();
    messages.clear();

    const size_t size = 16;
    const float x0 = use_hdpi ? screenW - 300 * 2 : screenW - 300;
    const float y0 = use_hdpi ? 128 : 64;
    const int inc = use_hdpi ? 48 : 24;
    float y = y0 + inc - size;

    textManager.render();

    checkGLError("end Application::drawHUD");
}